

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O2

string * __thiscall
TestNLHandler::EndNumberOf_abi_cxx11_
          (string *__return_storage_ptr__,TestNLHandler *this,ArgHandler *h)

{
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)h);
  MakeVarArg(__return_storage_ptr__,this,&local_40,&h->args_);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string EndNumberOf(ArgHandler h) { return MakeVarArg(h.name_, h.args_); }